

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeDisplay.cpp
# Opt level: O0

void __thiscall
eglu::NativeDisplayFactory::NativeDisplayFactory
          (NativeDisplayFactory *this,string *name,string *description,Capability capabilities)

{
  allocator<char> local_35 [17];
  Capability local_24;
  string *psStack_20;
  Capability capabilities_local;
  string *description_local;
  string *name_local;
  NativeDisplayFactory *this_local;
  
  local_24 = capabilities;
  psStack_20 = description;
  description_local = name;
  name_local = (string *)this;
  tcu::FactoryBase::FactoryBase(&this->super_FactoryBase,name,description);
  (this->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory =
       (_func_int **)&PTR__NativeDisplayFactory_0158fb98;
  tcu::FactoryRegistry<eglu::NativeWindowFactory>::FactoryRegistry(&this->m_nativeWindowRegistry);
  tcu::FactoryRegistry<eglu::NativePixmapFactory>::FactoryRegistry(&this->m_nativePixmapRegistry);
  this->m_capabilities = local_24;
  this->m_platformType = 0x3038;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_platformExtension,"",local_35);
  std::allocator<char>::~allocator(local_35);
  return;
}

Assistant:

NativeDisplayFactory::NativeDisplayFactory (const std::string& name, const std::string& description, NativeDisplay::Capability capabilities)
	: FactoryBase			(name, description)
	, m_capabilities		(capabilities)
	, m_platformType		(EGL_NONE)
	, m_platformExtension	("")
{
	DE_ASSERT(!(capabilities & NativeDisplay::CAPABILITY_GET_DISPLAY_PLATFORM));
	DE_ASSERT(capabilities & NativeDisplay::CAPABILITY_GET_DISPLAY_LEGACY);
}